

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageBase.cpp
# Opt level: O0

VkImageMemoryBarrier * __thiscall
myvk::ImageBase::GetMemoryBarrier
          (ImageBase *this,VkImageSubresourceLayers *region,VkAccessFlags src_access_mask,
          VkAccessFlags dst_access_mask,VkImageLayout old_layout,VkImageLayout new_layout,
          uint32_t src_queue_family,uint32_t dst_queue_family)

{
  VkAccessFlags in_ECX;
  VkImageAspectFlags *in_RDX;
  long in_RSI;
  VkImageMemoryBarrier *in_RDI;
  VkAccessFlags in_R8D;
  VkImageLayout in_R9D;
  VkImageLayout in_stack_00000008;
  VkImageMemoryBarrier *ret;
  uint32_t in_stack_00000018;
  VkImageSubresourceRange *range;
  
  memset(in_RDI,0,0x48);
  in_RDI->sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  in_RDI->image = *(VkImage *)(in_RSI + 0x18);
  in_RDI->oldLayout = in_R9D;
  in_RDI->newLayout = in_stack_00000008;
  in_RDI->srcAccessMask = in_ECX;
  in_RDI->dstAccessMask = in_R8D;
  in_RDI->srcQueueFamilyIndex = (uint32_t)ret;
  in_RDI->dstQueueFamilyIndex = in_stack_00000018;
  (in_RDI->subresourceRange).aspectMask = *in_RDX;
  (in_RDI->subresourceRange).baseMipLevel = in_RDX[1];
  (in_RDI->subresourceRange).levelCount = 1;
  (in_RDI->subresourceRange).baseArrayLayer = in_RDX[2];
  (in_RDI->subresourceRange).layerCount = in_RDX[3];
  return in_RDI;
}

Assistant:

VkImageMemoryBarrier ImageBase::GetMemoryBarrier(const VkImageSubresourceLayers &region, VkAccessFlags src_access_mask,
                                                 VkAccessFlags dst_access_mask, VkImageLayout old_layout,
                                                 VkImageLayout new_layout, uint32_t src_queue_family,
                                                 uint32_t dst_queue_family) const {
	VkImageMemoryBarrier ret = {};
	ret.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
	ret.image = m_image;
	ret.oldLayout = old_layout;
	ret.newLayout = new_layout;
	ret.srcAccessMask = src_access_mask;
	ret.dstAccessMask = dst_access_mask;
	ret.srcQueueFamilyIndex = src_queue_family;
	ret.dstQueueFamilyIndex = dst_queue_family;
	VkImageSubresourceRange &range = ret.subresourceRange;
	range.aspectMask = region.aspectMask;
	range.baseMipLevel = region.mipLevel;
	range.levelCount = 1;
	range.baseArrayLayer = region.baseArrayLayer;
	range.layerCount = region.layerCount;
	return ret;
}